

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

int __thiscall pbrt::Scene::writeTo(Scene *this,BinaryWriter *binary)

{
  int32_t iVar1;
  BinaryWriter *in_RSI;
  shared_ptr<pbrt::Film> *in_stack_ffffffffffffff78;
  BinaryWriter *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  BinaryWriter *in_stack_ffffffffffffffb8;
  BinaryWriter *in_stack_ffffffffffffffc0;
  
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Film,void>
            ((shared_ptr<pbrt::Entity> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  iVar1 = BinaryWriter::serialize
                    (in_stack_ffffffffffffffb8,
                     (SP *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  BinaryWriter::write<int>(in_stack_ffffffffffffff80,(int *)in_stack_ffffffffffffff78);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x225686);
  BinaryWriter::
  write<std::shared_ptr<pbrt::Camera>,std::allocator<std::shared_ptr<pbrt::Camera>>,void,void>
            (in_stack_ffffffffffffffc0,
             (vector<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
              *)in_stack_ffffffffffffffb8);
  std::shared_ptr<pbrt::Entity>::shared_ptr<pbrt::Object,void>
            ((shared_ptr<pbrt::Entity> *)in_RSI,
             (shared_ptr<pbrt::Object> *)in_stack_ffffffffffffff78);
  BinaryWriter::serialize(in_stack_ffffffffffffffb8,(SP *)CONCAT44(iVar1,in_stack_ffffffffffffffb0))
  ;
  BinaryWriter::write<int>(in_RSI,(int *)in_stack_ffffffffffffff78);
  std::shared_ptr<pbrt::Entity>::~shared_ptr((shared_ptr<pbrt::Entity> *)0x2256f3);
  return 1;
}

Assistant:

int Scene::writeTo(BinaryWriter &binary) 
  {
    binary.write(binary.serialize(film));
    binary.write(cameras);
    binary.write(binary.serialize(world));
    return TYPE_SCENE;
  }